

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

bool_t ec2IsValid(ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  ec_o *in_RSI;
  long in_RDI;
  void *unaff_retaddr;
  undefined1 local_11;
  
  bVar1 = ecIsOperable2(in_RSI);
  local_11 = 0;
  if (bVar1 != 0) {
    bVar1 = gf2IsValid((qr_o *)stack,unaff_retaddr);
    local_11 = 0;
    if ((bVar1 != 0) &&
       (local_11 = 0, *(ulong *)(*(long *)(in_RDI + 0x18) + 0x88) <= *(ulong *)(in_RDI + 0xa8))) {
      sVar3 = gf2Deg(*(qr_o **)(in_RDI + 0x18));
      if ((sVar3 & 0x3f) != 0) {
        iVar2 = wwCmp(*(word **)(in_RDI + 0x20),*(word **)(*(long *)(in_RDI + 0x18) + 0x18),
                      *(size_t *)(*(long *)(in_RDI + 0x18) + 0x30));
        local_11 = 0;
        if (-1 < iVar2) goto LAB_00181046;
      }
      sVar3 = gf2Deg(*(qr_o **)(in_RDI + 0x18));
      if ((sVar3 & 0x3f) != 0) {
        iVar2 = wwCmp(*(word **)(in_RDI + 0x28),*(word **)(*(long *)(in_RDI + 0x18) + 0x18),
                      *(size_t *)(*(long *)(in_RDI + 0x18) + 0x30));
        local_11 = 0;
        if (-1 < iVar2) goto LAB_00181046;
      }
      bVar1 = wwIsZero(*(word **)(in_RDI + 0x28),*(size_t *)(*(long *)(in_RDI + 0x18) + 0x30));
      local_11 = bVar1 != 0 ^ 0xff;
    }
  }
LAB_00181046:
  return (bool_t)(local_11 & 1);
}

Assistant:

bool_t ec2IsValid(const ec_o* ec, void* stack)
{
	// кривая работоспособна? поле ec->f корректно?
	// ec->deep >= ec->f->deep?
	// A, B \in ec->f, B != 0?
	return ecIsOperable2(ec) &&
		gf2IsValid(ec->f, stack) &&
		ec->deep >= ec->f->deep &&
		gf2IsIn(ec->A, ec->f) &&
		gf2IsIn(ec->B, ec->f) &&
		!qrIsZero(ec->B, ec->f);
}